

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

pointer __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>
::iterator::operator->(iterator *this)

{
  ctrl_t *pcVar1;
  ctrl_t *pcVar2;
  ctrl_t *pcVar3;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  ctrl_t cVar7;
  reference ppVar8;
  byte bVar9;
  uint uVar10;
  ulong extraout_RDX;
  ulong uVar11;
  long *in_RSI;
  ushort uVar12;
  ulong uVar13;
  pointer prVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  ctrl_t *pcStack_68;
  ctrl_t cVar18;
  ctrl_t cVar20;
  ctrl_t cVar21;
  ctrl_t cVar22;
  
  pcVar2 = this->ctrl_;
  if (pcVar2 == (ctrl_t *)0x0) {
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<void_const*,void_const*>,std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,std::default_delete<google::protobuf::DescriptorPool::MemoBase>>>,absl::lts_20250127::hash_internal::Hash<std::pair<void_const*,void_const*>>,std::equal_to<std::pair<void_const*,void_const*>>,std::allocator<std::pair<std::pair<void_const*,void_const*>const,std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,std::default_delete<google::protobuf::DescriptorPool::MemoBase>>>>>
    ::iterator::operator->((iterator *)this);
  }
  else if (pcVar2 != kEmptyGroup + 0x10) {
    if (kSentinel < *pcVar2) {
      ppVar8 = operator*(this);
      return ppVar8;
    }
    goto LAB_0060d632;
  }
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<void_const*,void_const*>,std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,std::default_delete<google::protobuf::DescriptorPool::MemoBase>>>,absl::lts_20250127::hash_internal::Hash<std::pair<void_const*,void_const*>>,std::equal_to<std::pair<void_const*,void_const*>>,std::allocator<std::pair<std::pair<void_const*,void_const*>const,std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,std::default_delete<google::protobuf::DescriptorPool::MemoBase>>>>>
  ::iterator::operator->((iterator *)this);
LAB_0060d632:
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<void_const*,void_const*>,std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,std::default_delete<google::protobuf::DescriptorPool::MemoBase>>>,absl::lts_20250127::hash_internal::Hash<std::pair<void_const*,void_const*>>,std::equal_to<std::pair<void_const*,void_const*>>,std::allocator<std::pair<std::pair<void_const*,void_const*>const,std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,std::default_delete<google::protobuf::DescriptorPool::MemoBase>>>>>
  ::iterator::operator->((iterator *)this);
  pcVar2 = this->ctrl_;
  if (((ulong)(pcVar2 + 1) & (ulong)pcVar2) != 0) {
    __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x14c,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  pcVar3 = this[1].ctrl_;
  uVar11 = (extraout_RDX >> 7 ^ (ulong)pcVar3 >> 0xc) & (ulong)pcVar2;
  bVar9 = (byte)extraout_RDX;
  prVar14 = (pointer)(ulong)(bVar9 & 0x7f);
  auVar16 = ZEXT216(CONCAT11(bVar9,bVar9) & 0x7f7f);
  auVar16 = pshuflw(auVar16,auVar16,0);
  pcStack_68 = (ctrl_t *)0x0;
  do {
    pcVar1 = pcVar3 + uVar11;
    cVar7 = pcVar1[0xf];
    cVar18 = auVar16[0];
    auVar19[0] = -(cVar18 == *pcVar1);
    cVar20 = auVar16[1];
    auVar19[1] = -(cVar20 == pcVar1[1]);
    cVar21 = auVar16[2];
    auVar19[2] = -(cVar21 == pcVar1[2]);
    cVar22 = auVar16[3];
    auVar19[3] = -(cVar22 == pcVar1[3]);
    auVar19[4] = -(cVar18 == pcVar1[4]);
    auVar19[5] = -(cVar20 == pcVar1[5]);
    auVar19[6] = -(cVar21 == pcVar1[6]);
    auVar19[7] = -(cVar22 == pcVar1[7]);
    auVar19[8] = -(cVar18 == pcVar1[8]);
    auVar19[9] = -(cVar20 == pcVar1[9]);
    auVar19[10] = -(cVar21 == pcVar1[10]);
    auVar19[0xb] = -(cVar22 == pcVar1[0xb]);
    auVar19[0xc] = -(cVar18 == pcVar1[0xc]);
    auVar19[0xd] = -(cVar20 == pcVar1[0xd]);
    auVar19[0xe] = -(cVar21 == pcVar1[0xe]);
    auVar19[0xf] = -(cVar22 == cVar7);
    uVar12 = (ushort)(SUB161(auVar19 >> 7,0) & 1) | (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe | (ushort)(auVar19[0xf] >> 7) << 0xf;
    uVar10 = (uint)uVar12;
    bVar15 = uVar12 == 0;
    if (!bVar15) {
      do {
        uVar4 = 0;
        if (uVar10 != 0) {
          for (; (uVar10 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
          }
        }
        uVar13 = uVar4 + uVar11 & (ulong)pcVar2;
        bVar5 = *(long *)((long)this[1].field_1.slot_ + uVar13 * 0x18 + 8) == in_RSI[1];
        bVar6 = this[1].field_1.slot_[uVar13].value.first.first == (void *)*in_RSI;
        if (bVar5 && bVar6) {
          if (this[1].ctrl_ == (ctrl_t *)0x0) {
            __assert_fail("ctrl != nullptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x9ef,
                          "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::pair<const void *, const void *>, std::unique_ptr<google::protobuf::DescriptorPool::MemoBase>>, absl::hash_internal::Hash<std::pair<const void *, const void *>>, std::equal_to<std::pair<const void *, const void *>>, std::allocator<std::pair<const std::pair<const void *, const void *>, std::unique_ptr<google::protobuf::DescriptorPool::MemoBase>>>>::iterator::iterator(ctrl_t *, slot_type *, const GenerationType *) [Policy = absl::container_internal::FlatHashMapPolicy<std::pair<const void *, const void *>, std::unique_ptr<google::protobuf::DescriptorPool::MemoBase>>, Hash = absl::hash_internal::Hash<std::pair<const void *, const void *>>, Eq = std::equal_to<std::pair<const void *, const void *>>, Alloc = std::allocator<std::pair<const std::pair<const void *, const void *>, std::unique_ptr<google::protobuf::DescriptorPool::MemoBase>>>]"
                         );
          }
          prVar14 = (pointer)(this[1].ctrl_ + uVar13);
        }
        if (bVar5 && bVar6) break;
        uVar12 = (ushort)(uVar10 - 1) & (ushort)uVar10;
        uVar10 = CONCAT22((short)(uVar10 - 1 >> 0x10),uVar12);
        bVar15 = uVar12 == 0;
      } while (!bVar15);
    }
    if (bVar15) {
      auVar17[0] = -(*pcVar1 == kEmpty);
      auVar17[1] = -(pcVar1[1] == kEmpty);
      auVar17[2] = -(pcVar1[2] == kEmpty);
      auVar17[3] = -(pcVar1[3] == kEmpty);
      auVar17[4] = -(pcVar1[4] == kEmpty);
      auVar17[5] = -(pcVar1[5] == kEmpty);
      auVar17[6] = -(pcVar1[6] == kEmpty);
      auVar17[7] = -(pcVar1[7] == kEmpty);
      auVar17[8] = -(pcVar1[8] == kEmpty);
      auVar17[9] = -(pcVar1[9] == kEmpty);
      auVar17[10] = -(pcVar1[10] == kEmpty);
      auVar17[0xb] = -(pcVar1[0xb] == kEmpty);
      auVar17[0xc] = -(pcVar1[0xc] == kEmpty);
      auVar17[0xd] = -(pcVar1[0xd] == kEmpty);
      auVar17[0xe] = -(pcVar1[0xe] == kEmpty);
      auVar17[0xf] = -(cVar7 == kEmpty);
      if ((((((((((((((((auVar17 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar17 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar17 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar17 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar17 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar17 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar17 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar17 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar17 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar17 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar17 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar17 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar17 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar17 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar17 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar7 == kEmpty) {
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>
        ::AssertNotDebugCapacity
                  ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>
                    *)this);
        prVar14 = (pointer)0x0;
        goto LAB_0060d744;
      }
      if (this->ctrl_ < pcStack_68 + 0x10) {
        __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xe37,
                      "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::pair<const void *, const void *>, std::unique_ptr<google::protobuf::DescriptorPool::MemoBase>>, absl::hash_internal::Hash<std::pair<const void *, const void *>>, std::equal_to<std::pair<const void *, const void *>>, std::allocator<std::pair<const std::pair<const void *, const void *>, std::unique_ptr<google::protobuf::DescriptorPool::MemoBase>>>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashMapPolicy<std::pair<const void *, const void *>, std::unique_ptr<google::protobuf::DescriptorPool::MemoBase>>, Hash = absl::hash_internal::Hash<std::pair<const void *, const void *>>, Eq = std::equal_to<std::pair<const void *, const void *>>, Alloc = std::allocator<std::pair<const std::pair<const void *, const void *>, std::unique_ptr<google::protobuf::DescriptorPool::MemoBase>>>, K = std::pair<const void *, const void *>]"
                     );
      }
      uVar11 = (ulong)(pcStack_68 + uVar11 + 0x10) & (ulong)pcVar2;
      bVar15 = true;
      pcStack_68 = pcStack_68 + 0x10;
    }
    else {
LAB_0060d744:
      bVar15 = false;
    }
    if (!bVar15) {
      return prVar14;
    }
  } while( true );
}

Assistant:

pointer operator->() const {
      AssertIsFull(ctrl_, generation(), generation_ptr(), "operator->");
      return &operator*();
    }